

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_tests.cpp
# Opt level: O1

bool FilterTest(char *filter,STATE ranTestHoge,STATE ranHogeTest,STATE ranFooBar,STATE ranFooBaz,
               STATE ranFooBarTest,STATE ranFooQux)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppTVar3;
  pointer ppTVar4;
  TestSuite *pTVar5;
  TestInfo *pTVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  Variable *pVVar11;
  UnitTestSource *this;
  UnitTest *pUVar12;
  int in_ECX;
  pointer ppTVar13;
  int in_EDX;
  int in_ESI;
  pointer ppTVar14;
  char *in_RDI;
  int in_R8D;
  STATE *in_R9;
  const_iterator it;
  int iVar15;
  const_iterator end;
  int nRan;
  AssertionResult iutest_ar;
  ScopedMessage scoped_message_0;
  allocator<char> local_265;
  uint local_264;
  AssertionResult local_260;
  iuCodeMessage local_238;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  char *local_1f0;
  undefined1 local_1e8 [392];
  ScopedMessage local_60;
  
  local_204 = (int)in_R9;
  TestHoge::state = 0;
  HogeTest::state = 0;
  FooBar::state = 0;
  FooBaz::state = 0;
  FooBarTest::state = 0;
  FooQux::state = 0;
  local_200 = in_R8D;
  local_1fc = in_ECX;
  local_1f8 = in_EDX;
  local_1f4 = in_ESI;
  pVVar11 = iutest::TestEnv::get_vars();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e8,(pVVar11->m_test_filter)._M_dataplus._M_p,
             (allocator<char> *)&local_60);
  iutest::TestEnv::OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
  operator=((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter> *)
            local_1e8,in_RDI);
  if ((undefined1 *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_) != local_1e8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_),local_1e8._16_8_ + 1);
  }
  this = iutest::UnitTestSource::GetInstance();
  iVar9 = iutest::UnitTestSource::Run(this);
  if (iVar9 == 0) {
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1e8);
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1e8,&local_1f0);
    std::__cxx11::stringbuf::str();
    local_238.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
    ;
    local_238.m_line = 0x3b;
    iutest::AssertionHelper::ScopedMessage::ScopedMessage(&local_60,&local_238);
    paVar1 = &local_238.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                    (int)local_238.m_message._M_dataplus._M_p) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                               (int)local_238.m_message._M_dataplus._M_p),
                      local_238.m_message.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
    std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x80));
    iutest::internal::CmpHelperEQ<TestHoge::STATE,TestHoge::STATE>
              (&local_260,(internal *)"ranTestHoge","TestHoge::state",(char *)&local_1f4,
               &TestHoge::state,in_R9);
    if (local_260.m_result == false) {
      memset((iu_global_format_stringstream *)local_1e8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,local_260.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_264);
      local_238.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
      ;
      local_238.m_line = 0x3d;
      local_238._44_4_ = 1;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_238,(Fixed *)local_1e8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                      (int)local_238.m_message._M_dataplus._M_p) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                                 (int)local_238.m_message._M_dataplus._M_p),
                        local_238.m_message.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
      std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x80));
    }
    paVar2 = &local_260.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_260.m_message._M_dataplus._M_p,
                      local_260.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::internal::CmpHelperEQ<HogeTest::STATE,HogeTest::STATE>
              (&local_260,(internal *)"ranHogeTest","HogeTest::state",(char *)&local_1f8,
               &HogeTest::state,in_R9);
    if (local_260.m_result == false) {
      memset((iu_global_format_stringstream *)local_1e8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,local_260.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_264);
      local_238.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
      ;
      local_238.m_line = 0x3e;
      local_238._44_4_ = 1;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_238,(Fixed *)local_1e8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                      (int)local_238.m_message._M_dataplus._M_p) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                                 (int)local_238.m_message._M_dataplus._M_p),
                        local_238.m_message.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
      std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_260.m_message._M_dataplus._M_p,
                      local_260.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::internal::CmpHelperEQ<FooBar::STATE,FooBar::STATE>
              (&local_260,(internal *)"ranFooBar","FooBar::state",(char *)&local_1fc,&FooBar::state,
               in_R9);
    if (local_260.m_result == false) {
      memset((iu_global_format_stringstream *)local_1e8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,local_260.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_264);
      local_238.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
      ;
      local_238.m_line = 0x3f;
      local_238._44_4_ = 1;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_238,(Fixed *)local_1e8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                      (int)local_238.m_message._M_dataplus._M_p) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                                 (int)local_238.m_message._M_dataplus._M_p),
                        local_238.m_message.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
      std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_260.m_message._M_dataplus._M_p,
                      local_260.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::internal::CmpHelperEQ<FooBaz::STATE,FooBaz::STATE>
              (&local_260,(internal *)"ranFooBaz","FooBaz::state",(char *)&local_200,&FooBaz::state,
               in_R9);
    if (local_260.m_result == false) {
      memset((iu_global_format_stringstream *)local_1e8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,local_260.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_264);
      local_238.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
      ;
      local_238.m_line = 0x40;
      local_238._44_4_ = 1;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_238,(Fixed *)local_1e8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                      (int)local_238.m_message._M_dataplus._M_p) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                                 (int)local_238.m_message._M_dataplus._M_p),
                        local_238.m_message.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
      std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_260.m_message._M_dataplus._M_p,
                      local_260.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::internal::CmpHelperEQ<FooBarTest::STATE,FooBarTest::STATE>
              (&local_260,(internal *)"ranFooBarTest","FooBarTest::state",(char *)&local_204,
               &FooBarTest::state,in_R9);
    if (local_260.m_result == false) {
      memset((iu_global_format_stringstream *)local_1e8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,local_260.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_264);
      local_238.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
      ;
      local_238.m_line = 0x41;
      local_238._44_4_ = 1;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_238,(Fixed *)local_1e8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                      (int)local_238.m_message._M_dataplus._M_p) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                                 (int)local_238.m_message._M_dataplus._M_p),
                        local_238.m_message.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
      std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_260.m_message._M_dataplus._M_p,
                      local_260.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::internal::CmpHelperEQ<FooQux::STATE,FooQux::STATE>
              (&local_260,(internal *)"ranFooQux","FooQux::state",(char *)&iutest_ar,&FooQux::state,
               in_R9);
    if (local_260.m_result == false) {
      memset((iu_global_format_stringstream *)local_1e8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,local_260.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_264);
      local_238.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
      ;
      local_238.m_line = 0x42;
      local_238._44_4_ = 1;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_238,(Fixed *)local_1e8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                      (int)local_238.m_message._M_dataplus._M_p) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                                 (int)local_238.m_message._M_dataplus._M_p),
                        local_238.m_message.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
      std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_260.m_message._M_dataplus._M_p,
                      local_260.m_message.field_2._M_allocated_capacity + 1);
    }
    local_264 = (uint)(local_1f4 != 0);
    if (local_1f8 != 0) {
      local_264 = 2 - (local_1f4 == 0);
    }
    if (local_1fc != 0) {
      local_264 = local_264 + 1;
    }
    if (local_200 != 0) {
      local_264 = local_264 + 1;
    }
    if (local_204 != 0) {
      local_264 = local_264 + 1;
    }
    if ((int)iutest_ar.m_message._M_dataplus._M_p != 0) {
      local_264 = local_264 + 1;
    }
    pUVar12 = iutest::UnitTest::instance();
    local_1e8._0_4_ = 0;
    for (ppTVar13 = (pUVar12->super_UnitTestImpl).m_testsuites.
                    super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        ppTVar13 !=
        (pUVar12->super_UnitTestImpl).m_testsuites.
        super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppTVar13 = ppTVar13 + 1) {
      ppTVar14 = ((*ppTVar13)->m_testinfos).
                 super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppTVar3 = ((*ppTVar13)->m_testinfos).
                super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      iVar9 = 0;
      if (ppTVar14 != ppTVar3) {
        iVar9 = 0;
        do {
          in_R9 = (STATE *)(ulong)(*ppTVar14)->m_matches_filter;
          iVar9 = iVar9 + (uint)(*ppTVar14)->m_matches_filter;
          ppTVar14 = ppTVar14 + 1;
        } while (ppTVar14 != ppTVar3);
      }
      local_1e8._0_4_ = local_1e8._0_4_ + iVar9;
    }
    iutest::internal::CmpHelperEQ<int,int>
              (&local_260,(internal *)0x12623d,
               "::iutest::UnitTest::GetInstance()->reportable_test_count()",(char *)&local_264,
               (int *)local_1e8,(int *)in_R9);
    if (local_260.m_result == false) {
      memset((iu_global_format_stringstream *)local_1e8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,local_260.m_message._M_dataplus._M_p,&local_265);
      local_238.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
      ;
      local_238.m_line = 0x4e;
      local_238._44_4_ = 1;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_238,(Fixed *)local_1e8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                      (int)local_238.m_message._M_dataplus._M_p) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                                 (int)local_238.m_message._M_dataplus._M_p),
                        local_238.m_message.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
      std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_260.m_message._M_dataplus._M_p,
                      local_260.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1e8._0_4_ = 0;
    pUVar12 = iutest::UnitTest::instance();
    local_238.m_message._M_dataplus._M_p._0_4_ = 0;
    for (ppTVar13 = (pUVar12->super_UnitTestImpl).m_testsuites.
                    super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        ppTVar13 !=
        (pUVar12->super_UnitTestImpl).m_testsuites.
        super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppTVar13 = ppTVar13 + 1) {
      ppTVar14 = ((*ppTVar13)->m_testinfos).
                 super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppTVar3 = ((*ppTVar13)->m_testinfos).
                super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      iVar9 = 0;
      if (ppTVar14 != ppTVar3) {
        iVar9 = 0;
        do {
          in_R9 = (STATE *)0x0;
          if ((*ppTVar14)->m_matches_filter == true) {
            in_R9 = (STATE *)(ulong)(*ppTVar14)->m_disable;
          }
          iVar9 = iVar9 + (int)in_R9;
          ppTVar14 = ppTVar14 + 1;
        } while (ppTVar14 != ppTVar3);
      }
      local_238.m_message._M_dataplus._M_p._0_4_ = (int)local_238.m_message._M_dataplus._M_p + iVar9
      ;
    }
    iutest::internal::CmpHelperEQ<int,int>
              (&local_260,(internal *)0x12642c,
               "::iutest::UnitTest::GetInstance()->reportable_disabled_test_count()",local_1e8,
               (int *)&local_238,(int *)in_R9);
    if (local_260.m_result == false) {
      memset((iu_global_format_stringstream *)local_1e8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,local_260.m_message._M_dataplus._M_p,&local_265);
      local_238.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
      ;
      local_238.m_line = 0x4f;
      local_238._44_4_ = 1;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_238,(Fixed *)local_1e8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                      (int)local_238.m_message._M_dataplus._M_p) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                                 (int)local_238.m_message._M_dataplus._M_p),
                        local_238.m_message.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
      std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_260.m_message._M_dataplus._M_p,
                      local_260.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1e8._0_4_ = 6 - local_264;
    pUVar12 = iutest::UnitTest::instance();
    ppTVar4 = (pUVar12->super_UnitTestImpl).m_testsuites.
              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    iVar9 = 0;
    for (ppTVar13 = (pUVar12->super_UnitTestImpl).m_testsuites.
                    super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppTVar13 != ppTVar4;
        ppTVar13 = ppTVar13 + 1) {
      pTVar5 = *ppTVar13;
      if (pTVar5->m_should_run_num == 0) {
        iVar15 = (int)((ulong)((long)(pTVar5->m_testinfos).
                                     super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pTVar5->m_testinfos).
                                    super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
      }
      else {
        ppTVar3 = (pTVar5->m_testinfos).
                  super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        iVar15 = 0;
        for (ppTVar14 = (pTVar5->m_testinfos).
                        super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>.
                        _M_impl.super__Vector_impl_data._M_start; ppTVar14 != ppTVar3;
            ppTVar14 = ppTVar14 + 1) {
          uVar10 = 1;
          if ((*ppTVar14)->m_ran == true) {
            bVar7 = iutest::TestInfo::is_skipped(*ppTVar14);
            uVar10 = (uint)bVar7;
          }
          iVar15 = iVar15 + uVar10;
        }
      }
      iVar9 = iVar9 + iVar15;
    }
    local_238.m_message._M_dataplus._M_p._0_4_ = iVar9;
    iutest::internal::CmpHelperEQ<int,int>
              (&local_260,(internal *)"kTotal-nRan",
               "::iutest::UnitTest::GetInstance()->skip_test_count()",local_1e8,(int *)&local_238,
               (int *)in_R9);
    if (local_260.m_result == false) {
      memset((iu_global_format_stringstream *)local_1e8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,local_260.m_message._M_dataplus._M_p,&local_265);
      local_238.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
      ;
      local_238.m_line = 0x53;
      local_238._44_4_ = 1;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_238,(Fixed *)local_1e8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                      (int)local_238.m_message._M_dataplus._M_p) != &local_238.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                                 (int)local_238.m_message._M_dataplus._M_p),
                        local_238.m_message.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
      std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.m_message._M_dataplus._M_p != &local_260.m_message.field_2) {
      operator_delete(local_260.m_message._M_dataplus._M_p,
                      local_260.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1e8._0_4_ = 0;
    pUVar12 = iutest::UnitTest::instance();
    ppTVar4 = (pUVar12->super_UnitTestImpl).m_testsuites.
              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    iVar9 = 0;
    for (ppTVar13 = (pUVar12->super_UnitTestImpl).m_testsuites.
                    super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppTVar13 != ppTVar4;
        ppTVar13 = ppTVar13 + 1) {
      pTVar5 = *ppTVar13;
      ppTVar14 = (pTVar5->m_testinfos).
                 super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppTVar3 = (pTVar5->m_testinfos).
                super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (pTVar5->m_should_run_num == 0) {
        if (ppTVar14 == ppTVar3) goto LAB_00113e07;
        iVar15 = 0;
        do {
          iVar15 = iVar15 + (uint)(*ppTVar14)->m_matches_filter;
          ppTVar14 = ppTVar14 + 1;
        } while (ppTVar14 != ppTVar3);
      }
      else if (ppTVar14 == ppTVar3) {
LAB_00113e07:
        iVar15 = 0;
      }
      else {
        iVar15 = 0;
        do {
          pTVar6 = *ppTVar14;
          uVar10 = 0;
          if ((pTVar6->m_matches_filter == true) && (uVar10 = 1, pTVar6->m_ran == true)) {
            bVar7 = iutest::TestInfo::is_skipped(pTVar6);
            uVar10 = (uint)bVar7;
          }
          iVar15 = iVar15 + uVar10;
          ppTVar14 = ppTVar14 + 1;
        } while (ppTVar14 != ppTVar3);
      }
      iVar9 = iVar9 + iVar15;
    }
    local_238.m_message._M_dataplus._M_p._0_4_ = iVar9;
    iutest::internal::CmpHelperEQ<int,int>
              (&local_260,(internal *)0x12642c,
               "::iutest::UnitTest::GetInstance()->reportable_skip_test_count()",local_1e8,
               (int *)&local_238,(int *)in_R9);
    if (local_260.m_result == false) {
      memset((iu_global_format_stringstream *)local_1e8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,local_260.m_message._M_dataplus._M_p,&local_265);
      local_238.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
      ;
      local_238.m_line = 0x54;
      local_238._44_4_ = 1;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_238,(Fixed *)local_1e8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                      (int)local_238.m_message._M_dataplus._M_p) != &local_238.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                                 (int)local_238.m_message._M_dataplus._M_p),
                        local_238.m_message.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
      std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.m_message._M_dataplus._M_p != &local_260.m_message.field_2) {
      operator_delete(local_260.m_message._M_dataplus._M_p,
                      local_260.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1e8._0_4_ = 0;
    pUVar12 = iutest::UnitTest::instance();
    ppTVar4 = (pUVar12->super_UnitTestImpl).m_testsuites.
              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    iVar9 = 0;
    for (ppTVar13 = (pUVar12->super_UnitTestImpl).m_testsuites.
                    super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppTVar13 != ppTVar4;
        ppTVar13 = ppTVar13 + 1) {
      pTVar5 = *ppTVar13;
      iVar15 = 0;
      if (pTVar5->m_should_run_num != 0) {
        ppTVar14 = (pTVar5->m_testinfos).
                   super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppTVar3 = (pTVar5->m_testinfos).
                  super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (ppTVar14 != ppTVar3) {
          iVar15 = 0;
          do {
            pTVar6 = *ppTVar14;
            uVar10 = 0;
            if ((pTVar6->m_matches_filter == true) && (pTVar6->m_should_run == true)) {
              bVar7 = iutest::TestInfo::is_skipped(pTVar6);
              uVar10 = (uint)bVar7;
            }
            iVar15 = iVar15 + uVar10;
            ppTVar14 = ppTVar14 + 1;
          } while (ppTVar14 != ppTVar3);
        }
      }
      iVar9 = iVar9 + iVar15;
    }
    local_238.m_message._M_dataplus._M_p._0_4_ = iVar9;
    iutest::internal::CmpHelperEQ<int,int>
              (&local_260,(internal *)0x12642c,
               "::iutest::UnitTest::GetInstance()->reportable_test_run_skipped_count()",local_1e8,
               (int *)&local_238,(int *)in_R9);
    if (local_260.m_result == false) {
      memset((iu_global_format_stringstream *)local_1e8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,local_260.m_message._M_dataplus._M_p,&local_265);
      local_238.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
      ;
      local_238.m_line = 0x55;
      local_238._44_4_ = 1;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_238,(Fixed *)local_1e8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                      (int)local_238.m_message._M_dataplus._M_p) != &local_238.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_238.m_message._M_dataplus._M_p._4_4_,
                                 (int)local_238.m_message._M_dataplus._M_p),
                        local_238.m_message.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
      std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.m_message._M_dataplus._M_p != &local_260.m_message.field_2) {
      operator_delete(local_260.m_message._M_dataplus._M_p,
                      local_260.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::AssertionHelper::ScopedMessage::~ScopedMessage(&local_60);
    pUVar12 = iutest::UnitTest::instance();
    bVar7 = iutest::TestResult::Failed(&(pUVar12->super_UnitTestImpl).m_ad_hoc_testresult);
    if (!bVar7) {
      ppTVar13 = (pUVar12->super_UnitTestImpl).m_testsuites.
                 super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar4 = (pUVar12->super_UnitTestImpl).m_testsuites.
                super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      bVar7 = ppTVar13 == ppTVar4;
      if (bVar7) {
        return bVar7;
      }
      bVar8 = iutest::TestSuite::Passed(*ppTVar13);
      if (!bVar8) {
        return bVar7;
      }
      do {
        ppTVar13 = ppTVar13 + 1;
        bVar7 = ppTVar13 == ppTVar4;
        if (bVar7) {
          return bVar7;
        }
        bVar8 = iutest::TestSuite::Passed(*ppTVar13);
      } while (bVar8);
      return bVar7;
    }
  }
  return false;
}

Assistant:

bool FilterTest(const char* filter
    , TestHoge::STATE ranTestHoge
    , HogeTest::STATE ranHogeTest
    , FooBar::STATE ranFooBar
    , FooBaz::STATE ranFooBaz
    , FooBarTest::STATE ranFooBarTest
    , FooQux::STATE ranFooQux
)
{
    TestHoge::state = TestHoge::NOT_RAN;
    HogeTest::state = HogeTest::NOT_RAN;
    FooBar::state = FooBar::NOT_RAN;
    FooBaz::state = FooBaz::NOT_RAN;
    FooBarTest::state = FooBarTest::NOT_RAN;
    FooQux::state = FooQux::NOT_RAN;

    ::iutest::IUTEST_FLAG(filter) = filter;
    const int ret = IUTEST_RUN_ALL_TESTS();
    if( ret != 0 ) return false;

    {
        IUTEST_SCOPED_TRACE(filter);

        IUTEST_EXPECT_EQ( ranTestHoge  , TestHoge::state );
        IUTEST_EXPECT_EQ( ranHogeTest  , HogeTest::state );
        IUTEST_EXPECT_EQ( ranFooBar    , FooBar::state );
        IUTEST_EXPECT_EQ( ranFooBaz    , FooBaz::state );
        IUTEST_EXPECT_EQ( ranFooBarTest, FooBarTest::state );
        IUTEST_EXPECT_EQ( ranFooQux    , FooQux::state );

        int nRan = 0;

        if( ranTestHoge ) ++nRan;
        if( ranHogeTest ) ++nRan;
        if( ranFooBar ) ++nRan;
        if( ranFooBaz ) ++nRan;
        if( ranFooBarTest ) ++nRan;
        if( ranFooQux ) ++nRan;

#if !defined(IUTEST_USE_GTEST) || (defined(GTEST_MINOR) && GTEST_MINOR >= 0x07)
        IUTEST_EXPECT_EQ( nRan, ::iutest::UnitTest::GetInstance()->reportable_test_count() );
        IUTEST_EXPECT_EQ( 0, ::iutest::UnitTest::GetInstance()->reportable_disabled_test_count() );
#endif
#if !defined(IUTEST_USE_GTEST)
        const int kTotal = 6;
        IUTEST_EXPECT_EQ( kTotal-nRan, ::iutest::UnitTest::GetInstance()->skip_test_count() );
        IUTEST_EXPECT_EQ( 0, ::iutest::UnitTest::GetInstance()->reportable_skip_test_count() );
        IUTEST_EXPECT_EQ( 0, ::iutest::UnitTest::GetInstance()->reportable_test_run_skipped_count() );
#endif
    }
    return ::iutest::UnitTest::GetInstance()->Passed();
}